

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O0

void __thiscall L18_1::Useless::~Useless(Useless *this)

{
  ostream *this_00;
  void *this_01;
  Useless *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,"\ndestructor called, instance left: ");
  count = count + -1;
  this_01 = (void *)std::ostream::operator<<(this_00,count);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"deleted one: \n");
  showObject(this);
  if (this->pc != (char *)0x0) {
    operator_delete__(this->pc);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

Useless::~Useless() {
        cout << "\ndestructor called, instance left: " << --count << endl;
        cout << "deleted one: \n";
        showObject();
        delete [] pc;   //  delete the one created by 'new'

        cout << endl;
    }